

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::InnerProduct_x86_avx512::create_pipeline_int8_x86(InnerProduct_x86_avx512 *this,Option *opt)

{
  float fVar1;
  _func_int **pp_Var2;
  _func_int *p_Var3;
  int *piVar4;
  ulong uVar5;
  int _w;
  long lVar6;
  void *pvVar7;
  ulong uVar8;
  int j;
  size_t sVar9;
  byte bVar10;
  _func_int *p_Var11;
  int _elempack;
  size_t _elemsize;
  float fVar12;
  Mat weight_data_r2;
  Mat local_78;
  
  p_Var11 = this->_vptr_InnerProduct_x86_avx512[-3];
  uVar5 = (long)*(int *)(&this->field_0xd8 + (long)p_Var11) /
          (long)(int)*(uint *)(&this->field_0xd0 + (long)p_Var11);
  bVar10 = (*(uint *)(&this->field_0xd0 + (long)p_Var11) & 7) == 0 & opt->use_packing_layout;
  _elemsize = 1;
  if (bVar10 != 0) {
    _elemsize = 8;
  }
  p_Var11 = this->_vptr_InnerProduct_x86_avx512[-3];
  _w = (int)uVar5;
  Mat::reshape(&local_78,(Mat *)(&this->field_0x130 + (long)p_Var11),_w,
               *(int *)(&this->field_0xd0 + (long)p_Var11),(Allocator *)0x0);
  _elempack = (int)_elemsize;
  Mat::create(&this->weight_data_tm,_w,
              *(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_avx512[-3]) /
              _elempack,_elemsize,_elempack,(Allocator *)0x0);
  pp_Var2 = this->_vptr_InnerProduct_x86_avx512;
  if (_elempack <= *(int *)(&this->field_0xd0 + (long)pp_Var2[-3])) {
    lVar6 = 0;
    do {
      if (0 < _w) {
        pvVar7 = (void *)((ulong)((uint)lVar6 >> bVar10 * '\x03') * (long)(this->weight_data_tm).w *
                          (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
        uVar8 = 0;
        do {
          sVar9 = 0;
          do {
            *(undefined1 *)((long)pvVar7 + sVar9) =
                 *(undefined1 *)
                  ((long)local_78.data +
                  uVar8 + (long)local_78.w * (lVar6 + sVar9) * local_78.elemsize);
            sVar9 = sVar9 + 1;
          } while (_elemsize != sVar9);
          uVar8 = uVar8 + 1;
          pvVar7 = (void *)((long)pvVar7 + sVar9);
        } while (uVar8 != (uVar5 & 0xffffffff));
      }
      lVar6 = lVar6 + _elemsize;
    } while ((long)(lVar6 + (ulong)(_elempack - 1)) <
             (long)*(int *)(&this->field_0xd0 + (long)pp_Var2[-3]));
  }
  if (local_78.refcount != (int *)0x0) {
    LOCK();
    *local_78.refcount = *local_78.refcount + -1;
    UNLOCK();
    if (*local_78.refcount == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  Mat::create(&this->scale_in_data,
              *(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_avx512[-3]),4,
              (Allocator *)0x0);
  pp_Var2 = this->_vptr_InnerProduct_x86_avx512;
  p_Var3 = pp_Var2[-3];
  p_Var11 = (_func_int *)((long)&this->_vptr_InnerProduct_x86_avx512 + (long)p_Var3);
  if (0 < *(int *)(&this->field_0xd0 + (long)p_Var3)) {
    pvVar7 = (this->scale_in_data).data;
    lVar6 = 0;
    do {
      fVar1 = *(float *)(*(long *)(p_Var11 + 0x1c0) + lVar6 * 4);
      fVar12 = 0.0;
      if (fVar1 != 0.0) {
        fVar12 = 1.0 / (fVar1 * **(float **)(p_Var11 + 0x208));
      }
      *(float *)((long)pvVar7 + lVar6 * 4) = fVar12;
      lVar6 = lVar6 + 1;
      p_Var3 = pp_Var2[-3];
      p_Var11 = (_func_int *)((long)&this->_vptr_InnerProduct_x86_avx512 + (long)p_Var3);
    } while (lVar6 < *(int *)(&this->field_0xd0 + (long)p_Var3));
  }
  if (opt->lightmode != false) {
    piVar4 = *(int **)(p_Var11 + 0x138);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (*(long **)(p_Var11 + 0x150) == (long *)0x0) {
          if (*(void **)(p_Var11 + 0x130) != (void *)0x0) {
            free(*(void **)(p_Var11 + 0x130));
          }
        }
        else {
          (**(code **)(**(long **)(p_Var11 + 0x150) + 0x18))();
        }
      }
    }
    *(undefined8 *)(p_Var11 + 0x170) = 0;
    *(undefined8 *)(p_Var11 + 0x13c) = 0;
    *(undefined8 *)(p_Var11 + 0x144) = 0;
    *(undefined8 *)(p_Var11 + 0x130) = 0;
    *(undefined8 *)(p_Var11 + 0x138) = 0;
    *(undefined8 *)(p_Var11 + 0x158) = 0;
    *(undefined8 *)(p_Var11 + 0x160) = 0;
    *(undefined4 *)(p_Var11 + 0x168) = 0;
  }
  return 0;
}

Assistant:

int InnerProduct_x86_avx512::create_pipeline_int8_x86(const Option& opt)
{
    const int num_input = weight_data_size / num_output;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        out_elempack = num_output % 8 == 0 ? 8 : 1;
    }
#endif // __SSE2__

    // src = inch-outch
    // dst = pb-inch-outch/pb
    {
        Mat weight_data_r2 = weight_data.reshape(num_input, num_output);

        weight_data_tm.create(num_input, num_output / out_elempack, (size_t)out_elempack, out_elempack);

        for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
        {
            signed char* g0 = weight_data_tm.row<signed char>(q / out_elempack);

            for (int p = 0; p < num_input; p++)
            {
                for (int j = 0; j < out_elempack; j++)
                {
                    *g0++ = weight_data_r2.row<signed char>(q + j)[p];
                }
            }
        }
    }

    scale_in_data.create(num_output);
    for (int p = 0; p < num_output; p++)
    {
        // dequantize
        float scale_in;
        if (weight_data_int8_scales[p] == 0)
            scale_in = 0;
        else
            scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

        scale_in_data[p] = scale_in;
    }

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}